

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

bool __thiscall
jrtplib::RTPUDPv4Transmitter::ShouldAcceptData
          (RTPUDPv4Transmitter *this,uint32_t srcip,uint16_t srcport)

{
  PortInfo *pPVar1;
  bool bVar2;
  PortInfo **ppPVar3;
  reference puVar4;
  iterator local_128;
  _List_const_iterator<unsigned_short> local_120;
  iterator local_118;
  _List_const_iterator<unsigned_short> local_110;
  _List_const_iterator<unsigned_short> local_108;
  const_iterator end_3;
  const_iterator begin_3;
  const_iterator it_3;
  iterator local_e8;
  _List_const_iterator<unsigned_short> local_e0;
  iterator local_d8;
  _List_const_iterator<unsigned_short> local_d0;
  _List_const_iterator<unsigned_short> local_c8;
  const_iterator end_2;
  const_iterator begin_2;
  const_iterator it_2;
  PortInfo *inf_1;
  iterator local_a0;
  _List_const_iterator<unsigned_short> local_98;
  iterator local_90;
  _List_const_iterator<unsigned_short> local_88;
  _List_const_iterator<unsigned_short> local_80;
  const_iterator end_1;
  const_iterator begin_1;
  const_iterator it_1;
  iterator local_60;
  _List_const_iterator<unsigned_short> local_58;
  iterator local_50;
  _List_const_iterator<unsigned_short> local_48;
  _List_const_iterator<unsigned_short> local_40;
  const_iterator end;
  const_iterator begin;
  const_iterator it;
  PortInfo *inf;
  uint16_t srcport_local;
  RTPUDPv4Transmitter *pRStack_18;
  uint32_t srcip_local;
  RTPUDPv4Transmitter *this_local;
  
  inf._2_2_ = srcport;
  inf._4_4_ = srcip;
  pRStack_18 = this;
  if (this->receivemode == AcceptSome) {
    RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
    ::GotoElement(&this->acceptignoreinfo,(uint *)((long)&inf + 4));
    bVar2 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
            ::HasCurrentElement(&this->acceptignoreinfo);
    if (bVar2) {
      ppPVar3 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
                ::GetCurrentElement(&this->acceptignoreinfo);
      pPVar1 = *ppPVar3;
      if ((pPVar1->all & 1U) == 0) {
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&begin);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&end);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_40);
        local_50._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_48,&local_50);
        end._M_node = local_48._M_node;
        local_60._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_58,&local_60);
        local_40._M_node = local_58._M_node;
        begin = end;
        while (bVar2 = std::operator!=(&begin,&local_40), bVar2) {
          puVar4 = std::_List_const_iterator<unsigned_short>::operator*(&begin);
          if (*puVar4 == inf._2_2_) {
            return true;
          }
          std::_List_const_iterator<unsigned_short>::operator++(&begin,0);
        }
        this_local._7_1_ = false;
      }
      else {
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&begin_1);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&end_1);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_80);
        local_90._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_88,&local_90);
        end_1._M_node = local_88._M_node;
        local_a0._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_98,&local_a0);
        local_80._M_node = local_98._M_node;
        begin_1 = end_1;
        while (bVar2 = std::operator!=(&begin_1,&local_80), bVar2) {
          puVar4 = std::_List_const_iterator<unsigned_short>::operator*(&begin_1);
          if (*puVar4 == inf._2_2_) {
            return false;
          }
          std::_List_const_iterator<unsigned_short>::operator++(&begin_1,0);
        }
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
    ::GotoElement(&this->acceptignoreinfo,(uint *)((long)&inf + 4));
    bVar2 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
            ::HasCurrentElement(&this->acceptignoreinfo);
    if (bVar2) {
      ppPVar3 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
                ::GetCurrentElement(&this->acceptignoreinfo);
      pPVar1 = *ppPVar3;
      if ((pPVar1->all & 1U) == 0) {
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&begin_2);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&end_2);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_c8);
        local_d8._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_d0,&local_d8);
        end_2._M_node = local_d0._M_node;
        local_e8._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_e0,&local_e8);
        local_c8._M_node = local_e0._M_node;
        begin_2 = end_2;
        while (bVar2 = std::operator!=(&begin_2,&local_c8), bVar2) {
          puVar4 = std::_List_const_iterator<unsigned_short>::operator*(&begin_2);
          if (*puVar4 == inf._2_2_) {
            return false;
          }
          std::_List_const_iterator<unsigned_short>::operator++(&begin_2,0);
        }
        this_local._7_1_ = true;
      }
      else {
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&begin_3);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&end_3);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_108);
        local_118._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_110,&local_118);
        end_3._M_node = local_110._M_node;
        local_128._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_120,&local_128);
        local_108._M_node = local_120._M_node;
        begin_3 = end_3;
        while (bVar2 = std::operator!=(&begin_3,&local_108), bVar2) {
          puVar4 = std::_List_const_iterator<unsigned_short>::operator*(&begin_3);
          if (*puVar4 == inf._2_2_) {
            return true;
          }
          std::_List_const_iterator<unsigned_short>::operator++(&begin_3,0);
        }
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RTPUDPv4Transmitter::ShouldAcceptData(uint32_t srcip,uint16_t srcport)
{
	if (receivemode == RTPTransmitter::AcceptSome)
	{
		PortInfo *inf;

		acceptignoreinfo.GotoElement(srcip);
		if (!acceptignoreinfo.HasCurrentElement())
			return false;
		
		inf = acceptignoreinfo.GetCurrentElement();
		if (!inf->all) // only accept the ones in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return true;
			}
			return false;
		}
		else // accept all, except the ones in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return false;
			}
			return true;
		}
	}
	else // IgnoreSome
	{
		PortInfo *inf;

		acceptignoreinfo.GotoElement(srcip);
		if (!acceptignoreinfo.HasCurrentElement())
			return true;
		
		inf = acceptignoreinfo.GetCurrentElement();
		if (!inf->all) // ignore the ports in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return false;
			}
			return true;
		}
		else // ignore all, except the ones in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return true;
			}
			return false;
		}
	}
	return true;
}